

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall Clasp::LoopFormula::reason(LoopFormula *this,Solver *s,Literal p,LitVec *lits)

{
  bool bVar1;
  Literal LVar2;
  Literal *in_RCX;
  undefined4 in_EDX;
  LoopFormula *in_RDI;
  ConstraintScore *unaff_retaddr;
  Solver *in_stack_00000008;
  Literal in_stack_00000010;
  Literal *it;
  Literal *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32 uVar3;
  Literal *local_28;
  undefined4 in_stack_fffffffffffffff8;
  
  local_28 = begin(in_RDI);
  local_28 = local_28 + (int)(uint)(in_RDI->other_ == *(uint *)&in_RDI->field_0x10 >> 0x1f);
  while( true ) {
    uVar3 = local_28->rep_;
    bVar1 = isSentinel((Literal)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = Clasp::operator!=((Literal *)in_RDI,in_stack_ffffffffffffffb8);
    if (bVar1) {
      in_stack_ffffffffffffffb8 = in_RCX;
      LVar2 = Literal::operator~(in_RCX);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(uVar3,LVar2.rep_),
                 (Literal *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    local_28 = local_28 + 1;
  }
  Solver::updateOnReason
            (in_stack_00000008,unaff_retaddr,in_stack_00000010,
             (LitVec *)CONCAT44(in_EDX,in_stack_fffffffffffffff8));
  return;
}

Assistant:

void LoopFormula::reason(Solver& s, Literal p, LitVec& lits) {
	// p = body: all literals in active clause
	// p = atom: only bodies
	for (Literal* it = begin() + (other_ == xPos_); !isSentinel(*it); ++it) {
		if (*it != p) { lits.push_back(~*it); }
	}
	s.updateOnReason(act_, p, lits);
}